

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_parse_compact
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input64)

{
  secp256k1_scalar *in_RDX;
  void *in_RSI;
  long in_RDI;
  int overflow;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar *in_stack_ffffffffffffffc8;
  int iVar1;
  uchar *in_stack_ffffffffffffffd8;
  uint local_4;
  
  local_4 = 1;
  iVar1 = 0;
  if (in_RDI != 0) {
    if (in_RSI == (void *)0x0) {
      secp256k1_callback_call((secp256k1_callback *)0x100000000,(char *)in_stack_ffffffffffffffc8);
      local_4 = 0;
    }
    else if (in_RDX == (secp256k1_scalar *)0x0) {
      secp256k1_callback_call((secp256k1_callback *)0x100000000,(char *)in_stack_ffffffffffffffc8);
      local_4 = 0;
    }
    else {
      secp256k1_scalar_set_b32(in_RDX,in_stack_ffffffffffffffd8,(int *)0x100000000);
      local_4 = ((iVar1 != 0 ^ 0xffU) & 1) & local_4;
      secp256k1_scalar_set_b32(in_RDX,in_stack_ffffffffffffffd8,(int *)CONCAT44(local_4,iVar1));
      local_4 = ((iVar1 != 0 ^ 0xffU) & 1) & local_4;
      if (local_4 == 0) {
        memset(in_RSI,0,0x40);
      }
      else {
        secp256k1_ecdsa_signature_save
                  ((secp256k1_ecdsa_signature *)CONCAT44(local_4,iVar1),in_stack_ffffffffffffffc8,
                   (secp256k1_scalar *)0x102bd6);
      }
    }
    return local_4;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/secp256k1.c"
          ,0x186,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ecdsa_signature_parse_compact(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input64) {
    secp256k1_scalar r, s;
    int ret = 1;
    int overflow = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input64 != NULL);

    secp256k1_scalar_set_b32(&r, &input64[0], &overflow);
    ret &= !overflow;
    secp256k1_scalar_set_b32(&s, &input64[32], &overflow);
    ret &= !overflow;
    if (ret) {
        secp256k1_ecdsa_signature_save(sig, &r, &s);
    } else {
        memset(sig, 0, sizeof(*sig));
    }
    return ret;
}